

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  bool bVar1;
  reference ppcVar2;
  mapped_type *this_00;
  cmStateSnapshot local_b0;
  undefined1 local_88 [8];
  string snpProjName;
  string name;
  cmStateSnapshot snp;
  cmLocalGenerator *localGen;
  iterator __end1;
  iterator __begin1;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *__range1;
  cmGlobalGenerator *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&this->ProjectMap);
  __end1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin
                     (&this->LocalGenerators);
  localGen = (cmLocalGenerator *)
             std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end
                       (&this->LocalGenerators);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                                     *)&localGen), bVar1) {
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&__end1);
    snp.Position.Position = (PositionType)*ppcVar2;
    cmLocalGenerator::GetStateSnapshot
              ((cmStateSnapshot *)((long)&name.field_2 + 8),
               (cmLocalGenerator *)snp.Position.Position);
    std::__cxx11::string::string((string *)(snpProjName.field_2._M_local_buf + 8));
    do {
      cmStateSnapshot::GetProjectName_abi_cxx11_
                ((string *)local_88,(cmStateSnapshot *)((long)&name.field_2 + 8));
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&snpProjName.field_2 + 8),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_88);
      if (bVar1) {
        std::__cxx11::string::operator=
                  ((string *)(snpProjName.field_2._M_local_buf + 8),(string *)local_88);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,(key_type *)((long)&snpProjName.field_2 + 8));
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,(value_type *)&snp.Position.Position);
      }
      cmStateSnapshot::GetBuildsystemDirectoryParent
                (&local_b0,(cmStateSnapshot *)((long)&name.field_2 + 8));
      name.field_2._8_8_ = local_b0.State;
      snp.State = (cmState *)local_b0.Position.Tree;
      snp.Position.Tree =
           (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_b0.Position.Position;
      std::__cxx11::string::~string((string *)local_88);
      bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)((long)&name.field_2 + 8));
    } while (bVar1);
    std::__cxx11::string::~string((string *)(snpProjName.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_**,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    // for each local generator add all projects
    cmStateSnapshot snp = localGen->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(localGen);
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}